

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall HEkk::debugRetainedDataOk(HEkk *this,HighsLp *lp)

{
  long lVar1;
  HighsDebugStatus HVar2;
  HighsStatus HVar3;
  long in_RDI;
  bool invert_ok;
  HighsDebugStatus call_status_1;
  bool basis_correct;
  HighsDebugStatus call_status;
  HighsOptions *options;
  HighsDebugStatus return_status;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  HEkk *in_stack_ffffffffffffff98;
  allocator local_59;
  string local_58 [12];
  HighsInt in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  HEkk *in_stack_ffffffffffffffc0;
  HighsDebugStatus local_1c;
  HighsDebugStatus local_4;
  
  if (((*(byte *)(in_RDI + 0x2550) & 1) == 0) || (*(int *)(*(long *)(in_RDI + 8) + 0x15c) < 2)) {
    local_4 = kNotChecked;
  }
  else {
    local_1c = kOk;
    lVar1 = *(long *)(in_RDI + 8);
    if ((*(byte *)(in_RDI + 0x2554) & 1) != 0) {
      HVar2 = debugBasisCorrect(in_stack_ffffffffffffff98,
                                (HighsLp *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      HVar3 = debugDebugToHighsStatus(HVar2);
      if (HVar3 == kError) {
        highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kError,
                    "Supposed to be a Simplex basis, but incorrect\n");
        local_1c = kLogicalError;
      }
    }
    if ((*(byte *)(in_RDI + 0x2558) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,"HEkk::debugRetainedDataOk",&local_59);
      HVar2 = debugNlaCheckInvert(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                  in_stack_ffffffffffffffb4);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      HVar3 = debugDebugToHighsStatus(HVar2);
      if (HVar3 == kError) {
        highsLogDev((HighsLogOptions *)(lVar1 + 0x380),kError,
                    "Supposed to be a simplex basis inverse, but too inaccurate\n");
        local_1c = kLogicalError;
      }
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

HighsDebugStatus HEkk::debugRetainedDataOk(const HighsLp& lp) const {
  if (!this->status_.initialised_for_new_lp ||
      this->options_->highs_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;

  const HighsOptions& options = *(this->options_);
  if (this->status_.has_basis) {
    HighsDebugStatus call_status = this->debugBasisCorrect(&lp);
    const bool basis_correct =
        debugDebugToHighsStatus(call_status) != HighsStatus::kError;
    if (!basis_correct) {
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Supposed to be a Simplex basis, but incorrect\n");
      assert(basis_correct);
      return_status = HighsDebugStatus::kLogicalError;
    }
  }

  if (this->status_.has_invert) {
    HighsDebugStatus call_status =
        this->debugNlaCheckInvert("HEkk::debugRetainedDataOk");
    const bool invert_ok =
        debugDebugToHighsStatus(call_status) != HighsStatus::kError;
    if (!invert_ok) {
      highsLogDev(
          options.log_options, HighsLogType::kError,
          "Supposed to be a simplex basis inverse, but too inaccurate\n");
      assert(invert_ok);
      return_status = HighsDebugStatus::kLogicalError;
    }
  }
  return return_status;
}